

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.cc
# Opt level: O0

bool trng::operator==(status_type *S1,status_type *S2)

{
  int i;
  status_type *S2_local;
  status_type *S1_local;
  
  i = 0;
  while( true ) {
    if (0x26f < i) {
      return true;
    }
    if (S1->mt[i] != S2->mt[i]) break;
    i = i + 1;
  }
  return false;
}

Assistant:

bool operator==(const mt19937::status_type &S1, const mt19937::status_type &S2) {
    for (int i{0}; i < mt19937::status_type::N; ++i)
      if (S1.mt[i] != S2.mt[i])
        return false;
    return true;
  }